

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_median4
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  unique_color *puVar1;
  bool bVar2;
  bool bVar3;
  uint16 uVar4;
  uint i;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint j_1;
  vec<3U,_float> *pvVar8;
  undefined8 *puVar9;
  unsigned_short temp;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint j;
  ulong uVar15;
  uint i_7;
  uint i_5;
  byte bVar16;
  uint j_2;
  long lVar18;
  uint i_10;
  undefined8 *puVar19;
  dxt1_solution_coordinates dVar20;
  float fVar21;
  float fVar22;
  float dist2_1;
  float fVar23;
  float dist2;
  float fVar24;
  float fVar25;
  vec<3U,_float> result_2;
  fast_random rm;
  float new_weights [4];
  vec<3U,_float> result;
  vec3F means [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_e8;
  dxt1_solution_coordinates local_e4 [3];
  long local_d8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_d0 [2];
  float local_c8 [6];
  undefined8 *local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  long local_38;
  undefined8 uVar17;
  
  if ((this->m_unique_colors).m_size < 5) {
    uVar5 = (this->m_norm_unique_colors).m_size - 1;
    pvVar8 = (this->m_norm_unique_colors).m_p;
    puVar9 = &local_68;
    uVar12 = 0;
    do {
      uVar13 = (ulong)uVar5;
      if ((int)uVar12 < (int)uVar5) {
        uVar13 = uVar12 & 0xffffffff;
      }
      *(float *)(puVar9 + 1) = pvVar8[uVar13].m_s[2];
      *puVar9 = *(undefined8 *)pvVar8[uVar13].m_s;
      uVar12 = uVar12 + 1;
      puVar9 = (undefined8 *)((long)puVar9 + 0xc);
    } while (uVar12 != 4);
  }
  else {
    lVar18 = 0;
    do {
      *(float *)((long)&local_98 + lVar18 * 4) =
           low_color->m_s[lVar18] - (this->m_mean_norm_color).m_s[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_60 = (float)uStack_90;
    local_68 = local_98;
    lVar18 = 0;
    do {
      *(float *)((long)&local_98 + lVar18 * 4) =
           high_color->m_s[lVar18] - (this->m_mean_norm_color).m_s[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_3c = (float)uStack_90;
    local_44 = local_98;
    lVar18 = 0;
    do {
      fVar21 = *(float *)((long)&local_68 + lVar18 * 4);
      *(float *)((long)&local_98 + lVar18 * 4) =
           (*(float *)((long)&local_44 + lVar18 * 4) - fVar21) * 0.33333334 + fVar21;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_54 = (float)uStack_90;
    local_5c = local_98;
    lVar18 = 0;
    do {
      fVar21 = *(float *)((long)&local_68 + lVar18 * 4);
      *(float *)((long)&local_98 + lVar18 * 4) =
           (*(float *)((long)&local_44 + lVar18 * 4) - fVar21) * 0.6666667 + fVar21;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_48 = (float)uStack_90;
    local_50 = local_98;
    fast_random::fast_random((fast_random *)&local_d0[0].field_0);
    fVar21 = 1e+37;
    local_a8 = 0;
    iVar10 = 0;
    do {
      puVar9 = &local_98;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 0.0;
      uVar12 = (ulong)(this->m_unique_colors).m_size;
      fVar22 = 0.0;
      if (uVar12 != 0) {
        pvVar8 = (this->m_norm_unique_colors).m_p;
        puVar1 = (this->m_unique_colors).m_p;
        uVar13 = 0;
        do {
          lVar18 = 0;
          fVar24 = 0.0;
          do {
            fVar23 = *(float *)((long)&local_68 + lVar18 * 4) - pvVar8->m_s[lVar18];
            fVar24 = fVar24 + fVar23 * fVar23;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          uVar14 = 0;
          uVar15 = 1;
          puVar19 = &local_5c;
          do {
            fVar23 = 0.0;
            lVar18 = 0;
            do {
              fVar25 = *(float *)((long)puVar19 + lVar18 * 4) - pvVar8->m_s[lVar18];
              fVar23 = fVar23 + fVar25 * fVar25;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            if (fVar23 < fVar24) {
              uVar14 = uVar15 & 0xffffffff;
              fVar24 = fVar23;
            }
            uVar15 = uVar15 + 1;
            puVar19 = (undefined8 *)((long)puVar19 + 0xc);
          } while (uVar15 != 4);
          fVar23 = (float)puVar1[uVar13].m_weight;
          lVar18 = 0;
          do {
            local_e4[lVar18] = (dxt1_solution_coordinates)(pvVar8->m_s[lVar18] * fVar23);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar18 = (long)(int)uVar14;
          lVar7 = 0;
          do {
            *(float *)((long)&local_98 + lVar7 * 4 + lVar18 * 0xc) =
                 (float)local_e4[lVar7] + *(float *)((long)&local_98 + lVar7 * 4 + lVar18 * 0xc);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          fVar22 = fVar22 + fVar24;
          local_c8[lVar18] = fVar23 + local_c8[lVar18];
          uVar13 = uVar13 + 1;
          pvVar8 = pvVar8 + 1;
        } while (uVar13 != uVar12);
      }
      uVar12 = 0;
      fVar24 = 0.0;
      bVar2 = false;
      uVar13 = 0;
      do {
        fVar23 = local_c8[uVar12];
        if (fVar23 <= 0.0) {
          bVar2 = true;
        }
        else {
          lVar18 = 0;
          do {
            local_e4[lVar18] =
                 (dxt1_solution_coordinates)(*(float *)((long)puVar9 + lVar18 * 4) / fVar23);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          (&local_60)[uVar12 * 3] = local_e4[2];
          *(ulong *)((long)&local_68 + uVar12 * 0xc) =
               CONCAT44(local_e4[1],CONCAT22(local_e4[0].m_high_color,local_e4[0].m_low_color));
          if (fVar24 < fVar23) {
            uVar13 = uVar12 & 0xffffffff;
            fVar24 = fVar23;
          }
        }
        uVar12 = uVar12 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 0xc);
      } while (uVar12 != 4);
      local_d8 = CONCAT44(local_d8._4_4_,0x7cf0bdc2);
      if (bVar2) {
LAB_001794f0:
        if (iVar10 == 7 || (bool)(~bVar2 & 1)) {
          bVar3 = false;
          fVar21 = (float)local_d8;
        }
        else {
          local_b0 = (undefined8 *)CONCAT44(local_b0._4_4_,iVar10);
          uVar12 = (ulong)((int)uVar13 + (int)local_a8 & 3);
          lVar18 = uVar12 * 0xc;
          puVar9 = &local_68;
          uVar13 = 0;
          local_a0 = uVar12;
          do {
            if ((local_c8[uVar13] == 0.0) && (!NAN(local_c8[uVar13]))) {
              if (uVar13 != uVar12) {
                lVar7 = 0;
                do {
                  *(undefined4 *)((long)puVar9 + lVar7 * 4) =
                       *(undefined4 *)((long)&local_68 + lVar7 * 4 + lVar18);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
              }
              lVar7 = 0;
              do {
                dVar20 = (dxt1_solution_coordinates)
                         fast_random::frand((fast_random *)&local_d0[0].field_0,-0.00196,0.00196);
                local_e4[lVar7] = dVar20;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              lVar7 = 0;
              do {
                *(float *)((long)puVar9 + lVar7 * 4) =
                     (float)local_e4[lVar7] + *(float *)((long)puVar9 + lVar7 * 4);
                lVar7 = lVar7 + 1;
                uVar12 = local_a0;
              } while (lVar7 != 3);
            }
            uVar13 = uVar13 + 1;
            puVar9 = (undefined8 *)((long)puVar9 + 0xc);
          } while (uVar13 != 4);
          local_a8 = (ulong)((int)local_a8 + 1);
          bVar3 = false;
          fVar21 = (float)local_d8;
          iVar10 = (int)local_b0;
        }
      }
      else {
        bVar3 = true;
        local_d8 = CONCAT44(local_d8._4_4_,fVar22);
        if (1e-05 <= ABS(fVar22 - fVar21)) goto LAB_001794f0;
      }
    } while ((!bVar3) && (iVar10 = iVar10 + 1, iVar10 != 8));
  }
  lVar18 = 1;
  puVar9 = &local_68;
  puVar19 = &local_5c;
  local_38 = 0;
  uVar17 = 0;
  do {
    local_38 = local_38 + 1;
    local_b0 = puVar19;
    local_a8 = lVar18;
    do {
      lVar7 = 0;
      do {
        *(float *)((long)&local_98 + lVar7 * 4) =
             *(float *)((long)puVar9 + lVar7 * 4) + (this->m_mean_norm_color).m_s[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_a0 = uVar17;
      lVar7 = 0;
      do {
        local_c8[lVar7] =
             *(float *)((long)puVar19 + lVar7 * 4) + (this->m_mean_norm_color).m_s[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_d8 = lVar18;
      fVar21 = floorf((float)local_98 * 31.0 + 0.5);
      iVar10 = (int)fVar21;
      fVar21 = floorf(local_98._4_4_ * 63.0 + 0.5);
      fVar22 = floorf((float)uStack_90 * 31.0 + 0.5);
      iVar6 = (int)fVar22;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      iVar11 = (int)fVar21;
      if (0xfe < (int)fVar21) {
        iVar11 = 0xff;
      }
      local_d0[0]._0_1_ = (undefined1)iVar10;
      local_d0[0]._1_1_ = (undefined1)iVar11;
      if (iVar11 < 1) {
        local_d0[0]._1_1_ = '\0';
      }
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      local_d0[0]._2_1_ = (undefined1)iVar6;
      if (iVar6 < 1) {
        local_d0[0]._2_1_ = '\0';
      }
      local_d0[0].field_0.a = 0xff;
      fVar21 = floorf(local_c8[0] * 31.0 + 0.5);
      iVar11 = (int)fVar21;
      fVar21 = floorf(local_c8[1] * 63.0 + 0.5);
      iVar10 = (int)fVar21;
      fVar21 = floorf(local_c8[2] * 31.0 + 0.5);
      iVar6 = (int)fVar21;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_e8.field_0.r = (uchar)iVar11;
      if (iVar11 < 1) {
        local_e8.field_0.r = '\0';
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      local_e8.field_0.g = (uchar)iVar10;
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      local_e8.field_0.b = (uchar)iVar6;
      if (iVar6 < 1) {
        local_e8.field_0.b = '\0';
      }
      local_e8.field_0.a = 0xff;
      uVar4 = dxt1_block::pack_color((color_quad_u8 *)&local_d0[0].field_0,false,0x7f);
      local_e4[0].m_low_color = uVar4;
      local_e4[0].m_high_color =
           dxt1_block::pack_color((color_quad_u8 *)&local_e8.field_0,false,0x7f);
      lVar18 = local_d8;
      if (uVar4 < local_e4[0].m_high_color) {
        local_e4[0].m_low_color = local_e4[0].m_high_color;
        local_e4[0].m_high_color = uVar4;
      }
      bVar2 = evaluate_solution(this,local_e4,false);
      bVar16 = (byte)local_a0;
      uVar17 = CONCAT71((int7)(local_a0 >> 8),bVar16 | bVar2);
      lVar18 = lVar18 + 1;
      puVar19 = (undefined8 *)((long)puVar19 + 0xc);
    } while (lVar18 != 4);
    lVar18 = local_a8 + 1;
    puVar9 = (undefined8 *)((long)puVar9 + 0xc);
    puVar19 = (undefined8 *)((long)local_b0 + 0xc);
  } while (local_38 != 3);
  bVar3 = refine_solution(this,(uint)(this->m_pParams->m_quality == cCRNDXTQualityUber));
  return (bool)(bVar3 | bVar16 & 1 | bVar2);
}

Assistant:

bool dxt1_endpoint_optimizer::try_median4(const vec3F& low_color, const vec3F& high_color) {
  vec3F means[4];

  if (m_unique_colors.size() <= 4) {
    for (uint i = 0; i < 4; i++)
      means[i] = m_norm_unique_colors[math::minimum<int>(m_norm_unique_colors.size() - 1, i)];
  } else {
    means[0] = low_color - m_mean_norm_color;
    means[3] = high_color - m_mean_norm_color;
    means[1] = vec3F::lerp(means[0], means[3], 1.0f / 3.0f);
    means[2] = vec3F::lerp(means[0], means[3], 2.0f / 3.0f);

    fast_random rm;

    const uint cMaxIters = 8;
    uint reassign_rover = 0;
    float prev_total_dist = math::cNearlyInfinite;
    for (uint iter = 0; iter < cMaxIters; iter++) {
      vec3F new_means[4];
      float new_weights[4];
      utils::zero_object(new_means);
      utils::zero_object(new_weights);

      float total_dist = 0;

      for (uint i = 0; i < m_unique_colors.size(); i++) {
        const vec3F& v = m_norm_unique_colors[i];

        float best_dist = means[0].squared_distance(v);
        int best_index = 0;

        for (uint j = 1; j < 4; j++) {
          float dist = means[j].squared_distance(v);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = j;
          }
        }

        total_dist += best_dist;

        new_means[best_index] += v * (float)m_unique_colors[i].m_weight;
        new_weights[best_index] += (float)m_unique_colors[i].m_weight;
      }

      uint highest_index = 0;
      float highest_weight = 0;
      bool empty_cell = false;
      for (uint j = 0; j < 4; j++) {
        if (new_weights[j] > 0.0f) {
          means[j] = new_means[j] / new_weights[j];
          if (new_weights[j] > highest_weight) {
            highest_weight = new_weights[j];
            highest_index = j;
          }
        } else
          empty_cell = true;
      }

      if (!empty_cell) {
        if (fabs(total_dist - prev_total_dist) < .00001f)
          break;

        prev_total_dist = total_dist;
      } else
        prev_total_dist = math::cNearlyInfinite;

      if ((empty_cell) && (iter != (cMaxIters - 1))) {
        const uint ri = (highest_index + reassign_rover) & 3;
        reassign_rover++;

        for (uint j = 0; j < 4; j++) {
          if (new_weights[j] == 0.0f) {
            means[j] = means[ri];
            means[j] += vec3F::make_random(rm, -.00196f, .00196f);
          }
        }
      }
    }
  }

  bool improved = false;

  for (uint i = 0; i < 3; i++) {
    for (uint j = i + 1; j < 4; j++) {
      const vec3F v0(means[i] + m_mean_norm_color);
      const vec3F v1(means[j] + m_mean_norm_color);

      dxt1_solution_coordinates sc(
          color_quad_u8((int)floor(.5f + v0[0] * 31.0f), (int)floor(.5f + v0[1] * 63.0f), (int)floor(.5f + v0[2] * 31.0f), 255),
          color_quad_u8((int)floor(.5f + v1[0] * 31.0f), (int)floor(.5f + v1[1] * 63.0f), (int)floor(.5f + v1[2] * 31.0f), 255), false);

      sc.canonicalize();
      improved |= evaluate_solution(sc);
    }
  }

  improved |= refine_solution((m_pParams->m_quality == cCRNDXTQualityUber) ? 1 : 0);

  return improved;
}